

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intercom_Control_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Intercom_Control_PDU::Decode
          (Intercom_Control_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  undefined1 local_80 [8];
  IntercomCommunicationParameters icp;
  KUINT32 ParamLength;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Intercom_Control_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x28) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Header7::Decode(&this->super_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = KDataStream::operator>>(pKStack_18,&(this->super_Header).super_Header6.field_0x27);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_CommChannelType).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,(DataTypeBase *)&this->m_SrcEnt);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16SrcCommDevID);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8SrcLineID);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8TransmitPriority);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8TransmitLineState);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8Command);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,(DataTypeBase *)&this->m_MstrEntID);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16MstrCommDeviceID);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16MstrChannelID);
  KDataStream::operator>>(pKVar2,&this->m_ui32IntrParamLen);
  std::
  vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
  ::clear(&this->m_vICP);
  icp._28_4_ = this->m_ui32IntrParamLen;
  while (icp._28_4_ != 0) {
    DATA_TYPE::IntercomCommunicationParameters::IntercomCommunicationParameters
              ((IntercomCommunicationParameters *)local_80,pKStack_18);
    std::
    vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
    ::push_back(&this->m_vICP,(IntercomCommunicationParameters *)local_80);
    KVar1 = DATA_TYPE::IntercomCommunicationParameters::GetLength
                      ((IntercomCommunicationParameters *)local_80);
    icp._28_4_ = icp._28_4_ - (KVar1 + 4);
    DATA_TYPE::IntercomCommunicationParameters::~IntercomCommunicationParameters
              ((IntercomCommunicationParameters *)local_80);
  }
  return;
}

Assistant:

void Intercom_Control_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < INTERCOM_CONTROL_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> m_ui8CtrlTyp
           >> KDIS_STREAM m_CommChannelType
           >> KDIS_STREAM m_SrcEnt
           >> m_ui16SrcCommDevID
           >> m_ui8SrcLineID
           >> m_ui8TransmitPriority
           >> m_ui8TransmitLineState
           >> m_ui8Command
           >> KDIS_STREAM m_MstrEntID
           >> m_ui16MstrCommDeviceID
           >> m_ui16MstrChannelID
           >> m_ui32IntrParamLen;

    m_vICP.clear();

    // Using the parameter length field to decode each parameter.
    KUINT32 ParamLength = m_ui32IntrParamLen;

    while( ParamLength )
    {
        IntercomCommunicationParameters icp( stream );

        m_vICP.push_back( icp );

        ParamLength -= icp.GetLength() + IntercomCommunicationParameters::INTERCOM_COMMS_PARAM_SIZE;
    }
}